

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O2

void __thiscall
pbrt::ExhaustiveLightSampler::ExhaustiveLightSampler
          (ExhaustiveLightSampler *this,span<const_pbrt::LightHandle> lights,Allocator alloc)

{
  LightBounds *value;
  long lVar1;
  LightHandle *first;
  vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_> *this_00;
  optional<pbrt::LightBounds> lb;
  size_t local_70;
  aligned_storage_t<sizeof(pbrt::LightBounds),_alignof(pbrt::LightBounds)> local_68;
  char local_34;
  
  first = lights.ptr;
  local_68._0_8_ = alloc.memoryResource;
  pstd::vector<pbrt::LightHandle,pstd::pmr::polymorphic_allocator<pbrt::LightHandle>>::
  vector<pbrt::LightHandle_const*>
            ((vector<pbrt::LightHandle,pstd::pmr::polymorphic_allocator<pbrt::LightHandle>> *)this,
             first,first + lights.n,(polymorphic_allocator<pbrt::LightHandle> *)&local_68.__align);
  (this->boundedLights).alloc.memoryResource = alloc.memoryResource;
  (this->boundedLights).nStored = 0;
  (this->boundedLights).ptr = (LightHandle *)0x0;
  (this->boundedLights).nAlloc = 0;
  (this->infiniteLights).alloc.memoryResource = alloc.memoryResource;
  (this->infiniteLights).ptr = (LightHandle *)0x0;
  (this->infiniteLights).nAlloc = 0;
  (this->infiniteLights).nStored = 0;
  (this->lightBounds).alloc.memoryResource = alloc.memoryResource;
  (this->lightBounds).nStored = 0;
  (this->lightBounds).ptr = (LightBounds *)0x0;
  (this->lightBounds).nAlloc = 0;
  HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  ::HashMap(&this->lightToBoundedIndex,
            (polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>)
            alloc.memoryResource);
  for (lVar1 = lights.n << 3; lVar1 != 0; lVar1 = lVar1 + -8) {
    LightHandle::Bounds((optional<pbrt::LightBounds> *)&local_68.__align,first);
    this_00 = &this->infiniteLights;
    if (local_34 == '\x01') {
      local_70 = (this->boundedLights).nStored;
      HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
      ::Insert(&this->lightToBoundedIndex,first,&local_70);
      value = pstd::optional<pbrt::LightBounds>::value
                        ((optional<pbrt::LightBounds> *)&local_68.__align);
      pstd::vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_>::
      push_back(&this->lightBounds,value);
      this_00 = &this->boundedLights;
    }
    pstd::vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_>::push_back
              (this_00,first);
    pstd::optional<pbrt::LightBounds>::~optional((optional<pbrt::LightBounds> *)&local_68.__align);
    first = first + 1;
  }
  return;
}

Assistant:

ExhaustiveLightSampler::ExhaustiveLightSampler(pstd::span<const LightHandle> lights,
                                               Allocator alloc)
    : lights(lights.begin(), lights.end(), alloc),
      boundedLights(alloc),
      infiniteLights(alloc),
      lightBounds(alloc),
      lightToBoundedIndex(alloc) {
    for (const auto &light : lights) {
        if (pstd::optional<LightBounds> lb = light.Bounds(); lb) {
            lightToBoundedIndex.Insert(light, boundedLights.size());
            lightBounds.push_back(*lb);
            boundedLights.push_back(light);
        } else
            infiniteLights.push_back(light);
    }
}